

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O2

int XNVCtrlSelectNotify(Display *dpy,int screen,int type,int onoff)

{
  XExtDisplayInfo *pXVar1;
  undefined1 *puVar2;
  int iVar3;
  
  pXVar1 = find_display(dpy);
  iVar3 = 0;
  if ((pXVar1 != (XExtDisplayInfo *)0x0) && (pXVar1->codes != (XExtCodes *)0x0)) {
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->lock_display)(dpy);
    }
    puVar2 = (undefined1 *)_XGetRequest(dpy,6,0xc);
    *puVar2 = (char)pXVar1->codes->major_opcode;
    puVar2[1] = 6;
    *(int *)(puVar2 + 4) = screen;
    *(short *)(puVar2 + 8) = (short)type;
    *(short *)(puVar2 + 10) = (short)onoff;
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->unlock_display)(dpy);
    }
    iVar3 = 1;
    if (dpy->synchandler != (_func_int__XDisplay_ptr *)0x0) {
      (*dpy->synchandler)(dpy);
    }
  }
  return iVar3;
}

Assistant:

Bool XNVCtrlSelectNotify (
    Display *dpy,
    int screen,
    int type,
    Bool onoff
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlSelectNotifyReq *req;

    if(!XextHasExtension (info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    LockDisplay (dpy);
    GetReq (nvCtrlSelectNotify, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlSelectNotify;
    req->screen = screen;
    req->notifyType = type;
    req->onoff = onoff;
    UnlockDisplay (dpy);
    SyncHandle ();

    return True;
}